

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O1

float dt(qnode_ptr_t c,qnode_ptr_t q,int x,int y)

{
  int iVar1;
  long lVar2;
  int iVar3;
  float fVar4;
  
  fVar4 = 0.0;
  if (-2 < C.m) {
    iVar3 = C.m / 2;
    iVar1 = -iVar3;
    if (0 < iVar3) {
      iVar1 = iVar3;
    }
    iVar1 = iVar1 + iVar3 + 1;
    lVar2 = 0;
    do {
      fVar4 = fVar4 + *(float *)(*(long *)((long)c->gauss_ptr + lVar2 * 2) +
                                (long)(x * c->res + y) * 4) * *(float *)((long)C.k + lVar2);
      lVar2 = lVar2 + 4;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return fVar4 / C.f;
}

Assistant:

float dt(c,q,x,y)
qnode_ptr_t c, q ;
int x, y ;

{ extern kernel_t C ;
  float d ;
  int i, k, h ;

  h = C.m/2 ;
  k = c->sizz/2 ;

  d = 0.0 ;
 for (i = -h ; i <= h ; i++) {
    d += (*c->gauss_ptr[i+h])[c->res*x + y]*C.k[i+h] ;
  }
  d /= C.f ;
  return(d) ;
}